

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

SUNErrCode N_VWrmsNormVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,sunrealtype *nrm)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  sunrealtype sVar6;
  double dVar7;
  double dVar8;
  
  if (nvec == 1) {
    sVar6 = N_VWrmsNorm_Serial(*X,*W);
    *nrm = sVar6;
  }
  else if (0 < nvec) {
    lVar1 = *(*X)->content;
    uVar5 = 0;
    do {
      lVar2 = *(long *)((long)X[uVar5]->content + 0x10);
      lVar3 = *(long *)((long)W[uVar5]->content + 0x10);
      nrm[uVar5] = 0.0;
      dVar7 = 0.0;
      if (0 < lVar1) {
        lVar4 = 0;
        do {
          dVar8 = *(double *)(lVar2 + lVar4 * 8) * *(double *)(lVar3 + lVar4 * 8);
          dVar7 = dVar7 + dVar8 * dVar8;
          nrm[uVar5] = dVar7;
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
      }
      dVar7 = dVar7 / (double)lVar1;
      dVar8 = 0.0;
      if (0.0 < dVar7) {
        if (dVar7 < 0.0) {
          dVar8 = sqrt(dVar7);
        }
        else {
          dVar8 = SQRT(dVar7);
        }
      }
      nrm[uVar5] = dVar8;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nvec);
  }
  return 0;
}

Assistant:

SUNErrCode N_VWrmsNormVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                         sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* wd = NULL;
  sunrealtype* xd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VWrmsNorm */
  if (nvec == 1)
  {
    nrm[0] = N_VWrmsNorm_Serial(X[0], W[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /* compute the WRMS norm for each vector in the vector array */
  for (i = 0; i < nvec; i++)
  {
    xd     = NV_DATA_S(X[i]);
    wd     = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j = 0; j < N; j++) { nrm[i] += SUNSQR(xd[j] * wd[j]); }
    nrm[i] = SUNRsqrt(nrm[i] / N);
  }

  return SUN_SUCCESS;
}